

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed32
          (UnknownFieldLiteParserHelper *this,uint32 num,uint32 value)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char buffer [4];
  uint32 local_2c;
  
  if (this->unknown_ != (string *)0x0) {
    uVar3 = (ulong)(num * 8 + 5);
    cVar2 = (char)this->unknown_;
    if (0x7f < num << 3) {
      do {
        std::__cxx11::string::push_back(cVar2);
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar2);
    local_2c = value;
    std::__cxx11::string::append((char *)this->unknown_,(ulong)&local_2c);
  }
  return;
}

Assistant:

void AddFixed32(uint32 num, uint32 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 5, unknown_);
    char buffer[4];
    io::CodedOutputStream::WriteLittleEndian32ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 4);
  }